

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O3

void ucnv_extContinueMatchFromU_63
               (UConverter *cnv,UConverterFromUnicodeArgs *pArgs,int32_t srcIndex,
               UErrorCode *pErrorCode)

{
  UChar *pre;
  UChar UVar1;
  UChar32 firstCP;
  int32_t iVar2;
  uint uVar3;
  char *bytes;
  long lVar4;
  uint32_t uVar5;
  int iVar6;
  char *pcVar7;
  undefined4 in_register_00000014;
  char cVar8;
  int preLength;
  int32_t *cx;
  UChar *src;
  uint32_t value;
  UErrorCode *local_68;
  undefined8 local_60;
  char local_58;
  char local_57 [39];
  
  local_60 = CONCAT44(in_register_00000014,srcIndex);
  value = 0;
  cx = (cnv->sharedData->mbcs).extIndexes;
  firstCP = cnv->preFromUFirstCP;
  pre = cnv->preFromU;
  cVar8 = cnv->preFromULength;
  preLength = (int)cVar8;
  src = pArgs->source;
  local_68 = pErrorCode;
  iVar2 = ucnv_extMatchFromU(cx,firstCP,pre,preLength,src,
                             (int32_t)((ulong)((long)pArgs->sourceLimit - (long)src) >> 1),&value,
                             cnv->useFallback,pArgs->flush);
  if (iVar2 < 2) {
    if (-1 < iVar2) {
      if (iVar2 == 1) {
        cnv->useSubChar1 = '\x01';
      }
      cnv->fromUChar32 = firstCP;
      cnv->preFromUFirstCP = -1;
      cnv->preFromULength = -cVar8;
      *local_68 = U_INVALID_CHAR_FOUND;
      return;
    }
    iVar6 = -2 - iVar2;
    if (preLength < iVar6) {
      lVar4 = (long)preLength;
      do {
        UVar1 = *src;
        src = src + 1;
        pre[lVar4] = UVar1;
        lVar4 = lVar4 + 1;
      } while (iVar6 != lVar4);
    }
    pArgs->source = src;
    cnv->preFromULength = (int8_t)iVar6;
    return;
  }
  uVar3 = iVar2 - 2;
  if ((int)uVar3 < preLength) {
    u_memmove_63(pre,pre + uVar3,preLength - uVar3);
    cVar8 = -(char)(preLength - uVar3);
    cx = (cnv->sharedData->mbcs).extIndexes;
  }
  else {
    pArgs->source = src + (int)(uVar3 - preLength);
    cVar8 = '\0';
  }
  cnv->preFromULength = cVar8;
  cnv->preFromUFirstCP = -1;
  uVar3 = value >> 0x18 & 0x1f;
  if (uVar3 < 4) {
    bytes = local_57;
    pcVar7 = bytes;
    if (uVar3 != 1) {
      if (uVar3 != 2) {
        if (uVar3 != 3) goto LAB_0031ea75;
        pcVar7 = local_57 + 1;
        local_57[0] = (char)(value >> 0x10);
      }
      *pcVar7 = (char)(value >> 8);
      pcVar7 = pcVar7 + 1;
    }
    *pcVar7 = (char)value;
  }
  else {
    bytes = (char *)((long)cx + (long)cx[8] + (ulong)(value & 0xffffff));
  }
LAB_0031ea75:
  pcVar7 = pArgs->targetLimit;
  uVar5 = cnv->fromUnicodeStatus;
  if (uVar5 != 0) {
    if (uVar3 == 1 && 1 < (int)uVar5) {
      local_58 = '\x0f';
      uVar5 = 1;
    }
    else {
      if (uVar3 < 2 || uVar5 != 1) goto LAB_0031eb07;
      local_58 = '\x0e';
      uVar5 = 2;
    }
    cnv->fromUnicodeStatus = uVar5;
    if (bytes != local_57) {
      memcpy(local_57,bytes,(ulong)uVar3);
    }
    uVar3 = uVar3 + 1;
    bytes = &local_58;
  }
LAB_0031eb07:
  ucnv_fromUWriteBytes_63
            (cnv,bytes,uVar3,&pArgs->target,pcVar7,&pArgs->offsets,(int32_t)local_60,local_68);
  return;
}

Assistant:

U_CFUNC void
ucnv_extContinueMatchFromU(UConverter *cnv,
                           UConverterFromUnicodeArgs *pArgs, int32_t srcIndex,
                           UErrorCode *pErrorCode) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match;

    match=ucnv_extMatchFromU(cnv->sharedData->mbcs.extIndexes,
                             cnv->preFromUFirstCP,
                             cnv->preFromU, cnv->preFromULength,
                             pArgs->source, (int32_t)(pArgs->sourceLimit-pArgs->source),
                             &value,
                             cnv->useFallback, pArgs->flush);
    if(match>=2) {
        match-=2; /* remove 2 for the initial code point */

        if(match>=cnv->preFromULength) {
            /* advance src pointer for the consumed input */
            pArgs->source+=match-cnv->preFromULength;
            cnv->preFromULength=0;
        } else {
            /* the match did not use all of preFromU[] - keep the rest for replay */
            int32_t length=cnv->preFromULength-match;
            u_memmove(cnv->preFromU, cnv->preFromU+match, length);
            cnv->preFromULength=(int8_t)-length;
        }

        /* finish the partial match */
        cnv->preFromUFirstCP=U_SENTINEL;

        /* write result */
        ucnv_extWriteFromU(cnv, cnv->sharedData->mbcs.extIndexes,
                           value,
                           &pArgs->target, pArgs->targetLimit,
                           &pArgs->offsets, srcIndex,
                           pErrorCode);
    } else if(match<0) {
        /* save state for partial match */
        const UChar *s;
        int32_t j;

        /* just _append_ the newly consumed input to preFromU[] */
        s=pArgs->source;
        match=-match-2; /* remove 2 for the initial code point */
        for(j=cnv->preFromULength; j<match; ++j) {
            U_ASSERT(j>=0);
            cnv->preFromU[j]=*s++;
        }
        pArgs->source=s; /* same as *src=srcLimit; because we reached the end of input */
        cnv->preFromULength=(int8_t)match;
    } else /* match==0 or 1 */ {
        /*
         * no match
         *
         * We need to split the previous input into two parts:
         *
         * 1. The first code point is unmappable - that's how we got into
         *    trying the extension data in the first place.
         *    We need to move it from the preFromU buffer
         *    to the error buffer, set an error code,
         *    and prepare the rest of the previous input for 2.
         *
         * 2. The rest of the previous input must be converted once we
         *    come back from the callback for the first code point.
         *    At that time, we have to try again from scratch to convert
         *    these input characters.
         *    The replay will be handled by the ucnv.c conversion code.
         */

        if(match==1) {
            /* matched, no mapping but request for <subchar1> */
            cnv->useSubChar1=TRUE;
        }

        /* move the first code point to the error field */
        cnv->fromUChar32=cnv->preFromUFirstCP;
        cnv->preFromUFirstCP=U_SENTINEL;

        /* mark preFromU for replay */
        cnv->preFromULength=-cnv->preFromULength;

        /* set the error code for unassigned */
        *pErrorCode=U_INVALID_CHAR_FOUND;
    }
}